

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_properties.cpp
# Opt level: O2

void ON_SetBinaryArchiveOpenNURBSVersion(ON_BinaryArchive *file,uint value)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  bVar1 = ON_VersionNumberIsValid(value);
  if (!bVar1) {
    uVar2 = ON_BinaryArchive::Archive3dmVersion(file);
    bVar1 = ON_VersionNumberIsYearMonthDateFormat(uVar2,value);
    if (bVar1) {
      if ((value < 0xc05e2c0) && (value % 10 == 9)) {
        uVar3 = ON_BinaryArchive::Archive3dmVersion(file);
        uVar2 = uVar3 / 10;
        if (uVar3 % 10 != 0) {
          uVar2 = uVar3;
        }
        if (uVar3 < 0x32) {
          uVar2 = uVar3;
        }
        if (uVar2 - 1 < 8) {
          value = (value + uVar2) - 9;
        }
      }
    }
    else {
      value = 0;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_properties.cpp"
                 ,0x1a7,"","ON_SetBinaryArchiveOpenNURBSVersion - invalid opennurbs version");
    }
  }
  file->m_3dm_opennurbs_version = value;
  return;
}

Assistant:

void ON_SetBinaryArchiveOpenNURBSVersion(ON_BinaryArchive& file, unsigned int value)
{
  if ( ON_VersionNumberIsValid(value) )
  {
    // can be yyyymmddn or a number from ON_VersionNumberConstruct().
    file.m_3dm_opennurbs_version = value;
  }
  else if ( ON_VersionNumberIsYearMonthDateFormat(file.Archive3dmVersion(),value) )
  {
    // can be yyyymmddn or a number from ON_VersionNumberConstruct().
    if ( 9 == (value%10) && value <= 201712319 )
    {
      // 9 marked debug versions.
      unsigned int n = file.Archive3dmVersion();
      if ( n >= 50 && 0 == (n%10) )
        n /= 10;
      if ( n > 0 && n < 9 )
        value = ((value/10)*10) + n;
    }
    file.m_3dm_opennurbs_version = value;
  }
  else
  {
    ON_ERROR("ON_SetBinaryArchiveOpenNURBSVersion - invalid opennurbs version");
    file.m_3dm_opennurbs_version = 0;
  }
}